

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QList<QCborArray> * __thiscall
QFactoryLoader::metaDataKeys(QList<QCborArray> *__return_storage_ptr__,QFactoryLoader *this)

{
  pointer puVar1;
  undefined1 *puVar2;
  long lVar3;
  byte *pbVar4;
  bool bVar5;
  QCborError QVar6;
  QStaticPlugin *pQVar7;
  int iVar8;
  pointer puVar9;
  ulong uVar10;
  QStaticPlugin *pQVar11;
  long in_FS_OFFSET;
  QLatin1StringView key;
  QCborContainerPrivate *local_108;
  QArrayDataPointer<QStaticPlugin> local_f8;
  QArrayDataPointer<char> local_d8;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  QCborArray QStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  char *local_70 [3];
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QCborArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_98._0_8_ = &(this->d).mutex;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_98._0_8_);
  local_98[8] = true;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->d).libraries.
                super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QCborValue::operator[]
              ((QCborValue *)local_b8,
               (QCborValue *)
               &((puVar9->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                 super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl)->metaData,4);
    key.m_data = "Keys";
    key.m_size = 4;
    QCborValue::operator[]((QCborValue *)&local_58,(QCborValue *)local_b8,key);
    QCborValue::toArray((QCborValue *)local_70);
    QList<QCborArray>::emplaceBack<QCborArray>(__return_storage_ptr__,(QCborArray *)local_70);
    QCborArray::~QCborArray((QCborArray *)local_70);
    QCborValue::~QCborValue((QCborValue *)&local_58);
    QCborValue::~QCborValue((QCborValue *)local_b8);
  }
  local_108 = (QCborContainerPrivate *)(this->d).iid.d.ptr;
  if (local_108 == (QCborContainerPrivate *)0x0) {
    local_108 = (QCborContainerPrivate *)&QByteArray::_empty;
  }
  puVar2 = (undefined1 *)(this->d).iid.d.size;
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
  QPluginLoader::staticPlugins();
  pQVar7 = local_f8.ptr + local_f8.size;
  pQVar11 = local_f8.ptr;
  do {
    if (pQVar11 == pQVar7) {
      QArrayDataPointer<QStaticPlugin>::~QArrayDataPointer(&local_f8);
      QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    lVar3 = pQVar11->rawMetaDataSize;
    pbVar4 = (byte *)pQVar11->rawMetaData;
    QStack_a0.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = local_108;
    local_a8 = (undefined1 *)0xaaaaaaaaaaaaaa00;
    local_b8._0_8_ = puVar2;
    QCborArray::QCborArray(&QStack_a0);
    if ((*pbVar4 & 0xfe) == 0) {
      local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::fromRawData((QByteArray *)&local_d8,(char *)(pbVar4 + 4),lVar3 + -4);
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_88,(QByteArray *)&local_d8);
      if (local_88[0x10] == 0xa0) {
        bVar5 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_88);
        if (bVar5) {
          do {
            if (local_88[0x10] == 0xff) {
              bVar5 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_88);
              if (!bVar5) break;
              goto LAB_002a929c;
            }
            if (local_88[0x10] < 0x21) {
              uVar10 = -(ulong)(local_88[0x10] == 0x20) ^ local_88._0_8_;
              iVar8 = (int)uVar10;
              if ((long)iVar8 != uVar10) goto LAB_002a929c;
              bVar5 = QCborStreamReader::next((QCborStreamReader *)local_88,10000);
              if (!bVar5) {
                QCborStreamReader::lastError((QCborStreamReader *)local_88);
                goto LAB_002a929c;
              }
              if (iVar8 == 4) {
                if (local_a8._0_1_ == true) {
                  iVar8 = -4;
                  if (local_88[0x10] == 0xa0) {
                    bVar5 = QCborStreamReader::isLengthKnown((QCborStreamReader *)local_88);
                    iVar8 = -4;
                    if (bVar5) {
                      bVar5 = QCborStreamReader::_enterContainer_helper
                                        ((QCborStreamReader *)local_88);
                      iVar8 = -1;
                      if (bVar5) {
                        while (local_88[0x10] != 0xff) {
                          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                          local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
                          QCborStreamReader::readAllUtf8String
                                    ((QByteArray *)&local_58,(QCborStreamReader *)local_88);
                          local_70[0] = "Keys";
                          bVar5 = ::operator==((QByteArray *)&local_58,local_70);
                          if (bVar5) {
                            QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
                            iVar8 = -4;
                            goto LAB_002a9264;
                          }
                          anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::skip
                                    ((QCborStreamReader *)local_88);
                          QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
                        }
                        goto LAB_002a9262;
                      }
                    }
                  }
                }
                else {
LAB_002a9262:
                  iVar8 = 0;
                }
              }
              else if (iVar8 == 2) {
                anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::operator()
                          ((QFactoryLoaderIidSearch *)local_b8,IID,(QCborStreamReader *)local_88);
                iVar8 = 1;
              }
              else {
                anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::skip
                          ((QCborStreamReader *)local_88);
                iVar8 = 1;
              }
            }
            else {
              if (local_88[0x10] != 0x60) goto LAB_002a929c;
              local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
              QCborStreamReader::readAllUtf8String
                        ((QByteArray *)&local_58,(QCborStreamReader *)local_88);
              bVar5 = QByteArray::isNull((QByteArray *)&local_58);
              if (bVar5) {
                iVar8 = -0x55555556;
                QCborStreamReader::lastError((QCborStreamReader *)local_88);
              }
              else {
                anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::skip
                          ((QCborStreamReader *)local_88);
                iVar8 = 1;
              }
              QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
              if (bVar5) goto LAB_002a929c;
            }
LAB_002a9264:
            QVar6 = QCborStreamReader::lastError((QCborStreamReader *)local_88);
            if ((iVar8 != 1) || (QVar6.c != NoError)) goto LAB_002a929c;
          } while( true );
        }
LAB_002a9294:
        QCborStreamReader::lastError((QCborStreamReader *)local_88);
      }
      else if (local_88[0x10] == 0xff) goto LAB_002a9294;
LAB_002a929c:
      QCborStreamReader::~QCborStreamReader((QCborStreamReader *)local_88);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
    }
    if (local_a8._0_1_ == true) {
      QList<QCborArray>::emplaceBack<QCborArray>(__return_storage_ptr__,&QStack_a0);
    }
    QCborArray::~QCborArray(&QStack_a0);
    pQVar11 = pQVar11 + 1;
  } while( true );
}

Assistant:

QList<QCborArray> QFactoryLoader::metaDataKeys() const
{
    QList<QCborArray> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries) {
        const QCborValue md = library->metaData.value(QtPluginMetaDataKeys::MetaData);
        metaData.append(md["Keys"_L1].toArray());
    }
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData),
                                  plugin.rawMetaDataSize);
        QFactoryLoaderMetaDataKeysExtractor extractor{ iid };
        iterateInPluginMetaData(pluginData, extractor);
        if (extractor.matchesIid)
            metaData += std::move(extractor.keys);
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}